

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionEndInfo::SectionEndInfo
          (SectionEndInfo *this,SectionInfo *_sectionInfo,Counts *_prevAssertions,
          double _durationInSeconds)

{
  undefined8 *in_RDX;
  SectionInfo *in_RDI;
  undefined8 in_XMM0_Qa;
  SectionInfo *unaff_retaddr;
  
  SectionInfo::SectionInfo(unaff_retaddr,in_RDI);
  *(undefined8 *)(in_RDI + 1) = *in_RDX;
  *(undefined8 *)&in_RDI[1].field_0x8 = in_RDX[1];
  *(undefined8 *)&in_RDI[1].field_0x10 = in_RDX[2];
  *(undefined8 *)&in_RDI[1].field_0x18 = in_XMM0_Qa;
  return;
}

Assistant:

SectionEndInfo( SectionInfo const& _sectionInfo, Counts const& _prevAssertions, double _durationInSeconds )
        : sectionInfo( _sectionInfo ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
        {}